

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O2

void __thiscall ANN::save(ANN *this,string *filepath)

{
  ostream *poVar1;
  pointer pLVar2;
  pointer pLVar3;
  uint uVar4;
  ulong uVar5;
  ofstream file;
  
  std::ofstream::ofstream(&file,(string *)filepath,_S_out);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
  std::operator<<(poVar1,'\n');
  uVar4 = 0;
  while( true ) {
    pLVar3 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar2 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pLVar2 - (long)pLVar3) / 0x58) <= (ulong)uVar4) break;
    Layer::get_nb_perceptrons(pLVar3 + uVar4);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
    std::operator<<(poVar1,", ");
    uVar4 = uVar4 + 1;
  }
  for (uVar4 = 0; uVar5 = (ulong)uVar4, uVar5 < ((long)pLVar2 - (long)pLVar3) / 0x58 - 1U;
      uVar4 = uVar4 + 1) {
    std::operator<<((ostream *)&file,'\n');
    Matrix::print_weights
              (&(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5].m_weights,(ostream *)&file);
    Matrix::print_weights
              (&(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5].m_biases,(ostream *)&file);
    pLVar3 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar2 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void ANN::save(const std::string& filepath) const{
    uint n_perceptron=0, n_weights=0;
    std::ofstream file(filepath);

    file<<m_layers.size()<<'\n';
    for(uint i=0;i<m_layers.size();++i){
        file<<m_layers[i].get_nb_perceptrons()<<", ";
    }
    for(uint i=0;i<m_layers.size()-1;++i){
        file<<'\n';
        m_layers[i].weights().print_weights(file);
        m_layers[i].biases().print_weights(file);
    }

    file.close();
}